

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
TargetRuntimeDllsBaseNode::CollectDlls
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,TargetRuntimeDllsBaseNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  bool bVar1;
  TargetType TVar2;
  const_reference name;
  cmGeneratorTarget *this_00;
  ostream *poVar3;
  cmComputeLinkInformation *this_01;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  undefined1 local_428 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> loc;
  cmGeneratorTarget **dll;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *__range2;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *dlls;
  cmComputeLinkInformation *cli;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream e_1;
  undefined1 local_208 [4];
  TargetType type;
  string local_1e8;
  ostringstream local_1b8 [8];
  ostringstream e;
  cmGeneratorTarget *gt;
  string *tgtName;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetRuntimeDllsBaseNode *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dllPaths;
  
  name = std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::front(parameters);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,name);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar3 = std::operator<<((ostream *)local_1b8,"Objects of target \"");
    poVar3 = std::operator<<(poVar3,(string *)name);
    std::operator<<(poVar3,"\" referenced but no such target exists.");
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_1e8,content);
    std::__cxx11::ostringstream::str();
    reportError(context,&local_1e8,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (((TVar2 == EXECUTABLE) || (TVar2 == SHARED_LIBRARY)) || (TVar2 == MODULE_LIBRARY)) {
      this_01 = cmGeneratorTarget::GetLinkInformation(this_00,&context->Config);
      if (this_01 == (cmComputeLinkInformation *)0x0) {
        memset(__return_storage_ptr__,0,0x18);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__return_storage_ptr__);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__return_storage_ptr__);
        this_02 = cmComputeLinkInformation::GetRuntimeDLLs(this_01);
        __end2 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ::begin(this_02);
        dll = (cmGeneratorTarget **)
              std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              end(this_02);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                                           *)&dll), bVar1) {
          loc.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_ = __gnu_cxx::
                    __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                    ::operator*(&__end2);
          cmGeneratorTarget::MaybeGetLocation
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_428,
                     *(cmGeneratorTarget **)
                      loc.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._32_8_,&context->Config);
          bVar1 = std::optional::operator_cast_to_bool((optional *)local_428);
          if (bVar1) {
            __args = std::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_428);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,__args);
          }
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_428);
          __gnu_cxx::
          __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
          ::operator++(&__end2);
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_388);
      poVar3 = std::operator<<((ostream *)local_388,"Objects of target \"");
      poVar3 = std::operator<<(poVar3,(string *)name);
      poVar3 = std::operator<<(poVar3,"\" referenced but is not one of the allowed target types ");
      std::operator<<(poVar3,"(EXECUTABLE, SHARED, MODULE).");
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_3a8,content);
      std::__cxx11::ostringstream::str();
      reportError(context,&local_3a8,(string *)&cli);
      std::__cxx11::string::~string((string *)&cli);
      std::__cxx11::string::~string((string *)&local_3a8);
      memset(__return_storage_ptr__,0,0x18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__return_storage_ptr__);
      std::__cxx11::ostringstream::~ostringstream(local_388);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> CollectDlls(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content) const
  {
    std::string const& tgtName = parameters.front();
    cmGeneratorTarget* gt = context->LG->FindGeneratorTargetToUse(tgtName);
    if (!gt) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but no such target exists.";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::vector<std::string>();
    }
    cmStateEnums::TargetType type = gt->GetType();
    if (type != cmStateEnums::EXECUTABLE &&
        type != cmStateEnums::SHARED_LIBRARY &&
        type != cmStateEnums::MODULE_LIBRARY) {
      std::ostringstream e;
      e << "Objects of target \"" << tgtName
        << "\" referenced but is not one of the allowed target types "
        << "(EXECUTABLE, SHARED, MODULE).";
      reportError(context, content->GetOriginalExpression(), e.str());
      return std::vector<std::string>();
    }

    if (auto* cli = gt->GetLinkInformation(context->Config)) {
      std::vector<std::string> dllPaths;
      auto const& dlls = cli->GetRuntimeDLLs();

      for (auto const& dll : dlls) {
        if (auto loc = dll->MaybeGetLocation(context->Config)) {
          dllPaths.emplace_back(*loc);
        }
      }

      return dllPaths;
    }

    return std::vector<std::string>();
  }